

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O2

void jinit_input_controller(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  
  pjVar1 = (jpeg_input_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x30);
  cinfo->inputctl = pjVar1;
  pjVar1->consume_input = consume_markers;
  pjVar1->reset_input_controller = reset_input_controller;
  pjVar1->start_input_pass = start_input_pass;
  pjVar1->finish_input_pass = finish_input_pass;
  pjVar1->has_multiple_scans = 0;
  pjVar1->eoi_reached = 0;
  *(undefined4 *)&pjVar1[1].consume_input = 1;
  return;
}

Assistant:

GLOBAL(void)
jinit_input_controller (j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl;

  /* Create subobject in permanent pool */
  inputctl = (my_inputctl_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				SIZEOF(my_input_controller));
  cinfo->inputctl = (struct jpeg_input_controller *) inputctl;
  /* Initialize method pointers */
  inputctl->pub.consume_input = consume_markers;
  inputctl->pub.reset_input_controller = reset_input_controller;
  inputctl->pub.start_input_pass = start_input_pass;
  inputctl->pub.finish_input_pass = finish_input_pass;
  /* Initialize state: can't use reset_input_controller since we don't
   * want to try to reset other modules yet.
   */
  inputctl->pub.has_multiple_scans = FALSE; /* "unknown" would be better */
  inputctl->pub.eoi_reached = FALSE;
  inputctl->inheaders = 1;
}